

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queens-seq.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  uint n_00;
  ulong uVar2;
  double dVar3;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  double local_40;
  double t2;
  long res;
  double t1;
  char *a;
  char **ppcStack_18;
  int n;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (argc == 1) {
    uStack_50 = 0x1013bc;
    usage(*argv);
    uStack_50 = 0x1013c6;
    exit(1);
  }
  uStack_50 = 0x1013d3;
  a._4_4_ = atoi(argv[1]);
  lVar1 = -((long)(int)a._4_4_ + 0xfU & 0xfffffffffffffff0);
  t1 = (double)(auStack_48 + lVar1);
  *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x101400;
  printf("running queens %d sequentially...\n");
  *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x101405;
  res = (long)wctime();
  n_00 = a._4_4_;
  dVar3 = t1;
  *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x101418;
  t2 = (double)nqueens(n_00,0,(char *)dVar3);
  *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x101421;
  local_40 = wctime();
  dVar3 = t2;
  uVar2 = (ulong)a._4_4_;
  *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x10143b;
  printf("Result: Q(%d) = %ld\n",uVar2,dVar3);
  dVar3 = local_40 - (double)res;
  *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x101453;
  printf("Time: %f\n",dVar3);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    if (1 == argc) {
        usage(argv[0]);
        exit(1);
    }

    int n = atoi(argv[1]);

    char *a = (char*)alloca(n*sizeof(char));

    printf("running queens %d sequentially...\n", n);

    double t1 = wctime();
    long res = nqueens(n, 0, a);
    double t2 = wctime();

    printf("Result: Q(%d) = %ld\n", n, res);

    printf("Time: %f\n", t2-t1);

    return 0;
}